

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

Transaction * __thiscall
cfd::core::Psbt::GetTxInUtxoFull
          (Transaction *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool *is_witness)

{
  long lVar1;
  wally_tx *tx;
  CfdException *this_00;
  undefined1 local_50 [32];
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x9fe,"GetTxInUtxoFull");
  lVar1 = *(long *)((long)this->wally_psbt_pointer_ + 0x10);
  tx = *(wally_tx **)(lVar1 + (ulong)index * 0x110);
  if (tx == (wally_tx *)0x0) {
    if (!ignore_error) {
      local_50._0_8_ = "cfdcore_psbt.cpp";
      local_50._8_4_ = 0xa0b;
      local_50._16_8_ = "GetTxInUtxoFull";
      logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"utxo full data not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"psbt utxo full data not found error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::Transaction(__return_storage_ptr__);
  }
  else {
    if (is_witness != (bool *)0x0) {
      *is_witness = *(long *)(lVar1 + (ulong)index * 0x110 + 8) != 0;
    }
    ConvertBitcoinTxFromWally((ByteData *)local_50,tx,false);
    Transaction::Transaction(__return_storage_ptr__,(ByteData *)local_50);
    if ((pointer)local_50._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Transaction Psbt::GetTxInUtxoFull(
    uint32_t index, bool ignore_error, bool *is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (is_witness != nullptr) {
      *is_witness = (psbt_pointer->inputs[index].witness_utxo != nullptr);
    }
    return Transaction(
        ConvertBitcoinTxFromWally(psbt_pointer->inputs[index].utxo, false));
  } else if (ignore_error) {
    return Transaction();
  } else {
    warn(CFD_LOG_SOURCE, "utxo full data not found.");
    throw CfdException(
        kCfdIllegalStateError, "psbt utxo full data not found error.");
  }
}